

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  undefined8 *puVar1;
  char cVar2;
  ushort uVar3;
  ulong uVar4;
  WhereLoop **ppWVar5;
  SrcList *pSVar6;
  WhereLoop *pWVar7;
  byte bVar8;
  i8 iVar9;
  LogEst LVar10;
  short sVar11;
  ushort uVar12;
  uint uVar13;
  int iVar14;
  int extraout_EAX;
  WherePath *pWVar15;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  short sVar16;
  uint uVar17;
  uint uVar18;
  WhereLoop ***pppWVar19;
  LogEst *pLVar20;
  undefined4 uVar21;
  long lVar22;
  Parse *pPVar23;
  int iVar24;
  uint uVar25;
  WherePath *pWVar26;
  undefined6 in_register_00000032;
  WhereLoop **ppWVar27;
  ExprList *pOrderBy;
  short sVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  Bitmask revMask;
  WherePath *local_d8;
  uint local_d0;
  Bitmask local_c8;
  ulong local_c0;
  ulong local_b8;
  int local_b0;
  uint local_ac;
  ulong local_a8;
  WherePath *local_a0;
  ulong local_98;
  int local_8c;
  Parse *local_88;
  undefined8 local_80;
  WhereLoop **local_78;
  WhereInfo *local_70;
  uint local_68;
  undefined4 local_64;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  WherePath *local_50;
  ulong local_48;
  LogEst *local_40;
  size_t local_38;
  
  local_80 = CONCAT62(in_register_00000032,nRowEst);
  local_88 = pWInfo->pParse;
  bVar8 = pWInfo->nLevel;
  uVar30 = (ulong)bVar8;
  uVar31 = 1;
  if (1 < bVar8) {
    uVar31 = (ulong)((uint)(bVar8 != 2) * 5 + 5);
  }
  local_b0 = 0;
  if (nRowEst != 0 && pWInfo->pOrderBy != (ExprList *)0x0) {
    local_b0 = pWInfo->pOrderBy->nExpr;
  }
  iVar24 = (int)uVar31 * 2;
  lVar22 = (long)local_b0;
  pWVar15 = (WherePath *)
            sqlite3DbMallocRawNN
                      (local_88->db,
                       (long)(int)(((uint)bVar8 * 8 + 0x20) * iVar24 + (int)(lVar22 * 2)));
  iVar14 = local_b0;
  if (pWVar15 == (WherePath *)0x0) {
    return 0;
  }
  uVar29 = (ulong)(uint)((int)uVar31 << 5);
  local_d8 = (WherePath *)((long)&pWVar15->maskLoop + uVar29);
  puVar1 = (undefined8 *)((long)&pWVar15->nRow + uVar29);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)&pWVar15->maskLoop + uVar29);
  *puVar1 = 0;
  puVar1[1] = 0;
  local_78 = (WhereLoop **)((long)&local_d8->maskLoop + uVar29);
  uVar25 = iVar24 + 1;
  pppWVar19 = &pWVar15->aLoop;
  do {
    *pppWVar19 = local_78;
    uVar25 = uVar25 - 1;
    local_78 = (WhereLoop **)((long)local_78 + (ulong)((uint)bVar8 * 8));
    pppWVar19 = pppWVar19 + 4;
  } while (1 < uVar25);
  local_a8 = uVar31;
  if (local_b0 == 0) {
    uVar25 = 0x30;
    if (local_88->nQueryLoop < 0x30) {
      uVar25 = local_88->nQueryLoop;
    }
    LVar10 = (LogEst)uVar25;
    local_78 = (WhereLoop **)0x0;
  }
  else {
    memset(local_78,0,lVar22 * 2);
    uVar25 = 0x30;
    if (local_88->nQueryLoop < 0x30) {
      uVar25 = local_88->nQueryLoop;
    }
    LVar10 = (LogEst)uVar25;
    local_d8->isOrdered = -(bVar8 != 0) | (byte)iVar14;
  }
  local_d8->nRow = LVar10;
  if (uVar30 != 0) {
    local_68 = (int)local_80 - 10;
    local_5c = 2;
    if (2 < (uint)local_a8) {
      local_5c = (uint)local_a8;
    }
    local_60 = (int)local_80 + -0x32;
    local_98 = 0;
    uVar25 = 0;
    uVar29 = 0;
    uVar31 = 0;
    uVar17 = 1;
    local_70 = pWInfo;
    local_50 = pWVar15;
    local_48 = uVar30;
    do {
      local_a0 = pWVar15;
      if ((int)uVar17 < 1) {
        local_d0 = 0;
      }
      else {
        local_38 = local_98 * 8;
        local_40 = &pWVar15[1].rUnsorted;
        uVar18 = 0;
        local_58 = (uint)local_98 & 0xffff;
        local_d0 = 0;
        pWVar15 = local_d8;
        local_54 = uVar17;
        do {
          pWVar7 = pWInfo->pLoops;
          pWInfo = local_70;
          for (; local_70 = pWInfo, pWVar7 != (WhereLoop *)0x0; pWVar7 = pWVar7->pNextLoop) {
            uVar30 = pWVar15->maskLoop;
            if ((((pWVar7->prereq & ~uVar30) == 0) &&
                (uVar4 = pWVar7->maskSelf, (uVar4 & uVar30) == 0)) &&
               ((sVar28 = pWVar15->nRow, (pWVar7->wsFlags & 0x4000) == 0 || (2 < sVar28)))) {
              local_c0 = uVar31;
              local_b8 = uVar29;
              LVar10 = sqlite3LogEstAdd(pWVar7->rSetup,pWVar7->rRun + sVar28);
              LVar10 = sqlite3LogEstAdd(LVar10,pWVar15->rUnsorted);
              iVar14 = (int)CONCAT62(extraout_var,LVar10);
              local_ac = (uint)(ushort)(sVar28 + pWVar7->nOut);
              bVar8 = pWVar15->isOrdered;
              if ((char)bVar8 < '\0') {
                local_c8 = 0;
                bVar8 = wherePathSatisfiesOrderBy
                                  (local_70,local_70->pOrderBy,pWVar15,local_70->wctrlFlags,
                                   (u16)local_58,pWVar7,&local_c8);
              }
              else {
                local_c8 = pWVar15->revLoop;
              }
              iVar24 = local_b0 - (char)bVar8;
              if ((iVar24 == 0 || local_b0 < (char)bVar8) || (char)bVar8 < '\0') {
                sVar28 = LVar10 + -2;
              }
              else {
                sVar11 = *(short *)((long)local_78 + (ulong)bVar8 * 2);
                if (sVar11 == 0) {
                  local_8c = iVar14;
                  LVar10 = sqlite3LogEst((long)((iVar24 * 100) / local_b0));
                  uVar21 = (undefined4)CONCAT62(extraout_var_00,LVar10);
                  uVar17._0_2_ = local_70->wctrlFlags;
                  uVar17._2_2_ = local_70->iLimit;
                  if (((uVar17 >> 0xe & 1) == 0) ||
                     (uVar13 = (uint)(ushort)local_70->iLimit, (short)local_80 <= local_70->iLimit))
                  {
                    uVar13 = (uint)local_80;
                    if ((uVar17 & 0x100) != 0) {
                      uVar13 = local_68;
                    }
                    if ((short)local_80 < 0xb) {
                      uVar13 = (uint)local_80;
                    }
                  }
                  if ((short)uVar13 < 0xb) {
                    sVar28 = 0;
                  }
                  else {
                    local_64 = uVar21;
                    LVar10 = sqlite3LogEst((ulong)(uVar13 & 0xffff));
                    sVar28 = LVar10 + -0x21;
                    uVar21 = local_64;
                  }
                  sVar11 = sVar28 + (short)local_60 + (short)uVar21;
                  *(short *)((long)local_78 + (ulong)bVar8 * 2) = sVar11;
                  iVar14 = local_8c;
                }
                sVar28 = (short)iVar14;
                uVar12 = sqlite3LogEstAdd(sVar28,sVar11);
                iVar14 = uVar12 + 5;
              }
              sVar11 = (short)iVar14;
              if ((local_98 == 0) && ((pWVar7->wsFlags & 0x2000000) != 0)) {
                sVar11 = sVar11 + -10;
                local_ac = local_ac - 0x1e;
              }
              sVar16 = (short)local_ac;
              iVar14 = (int)local_a8;
              uVar31 = local_c0;
              uVar29 = local_b8;
              if (0 < (int)local_d0) {
                pWVar26 = local_a0;
                uVar17 = local_d0;
                do {
                  if ((pWVar26->maskLoop == (uVar4 | uVar30)) &&
                     (-1 < (char)(pWVar26->isOrdered ^ bVar8))) {
                    if ((pWVar26->rCost < sVar11) ||
                       ((pWVar26->rCost == sVar11 &&
                        ((pWVar26->nRow < sVar16 ||
                         ((pWVar26->nRow == sVar16 && (pWVar26->rUnsorted <= sVar28))))))))
                    goto LAB_0019d563;
                    goto LAB_0019d451;
                  }
                  pWVar26 = pWVar26 + 1;
                  uVar17 = uVar17 - 1;
                } while (uVar17 != 0);
              }
              uVar17 = local_d0;
              if ((int)local_a8 <= (int)local_d0) {
                if (((short)local_b8 < sVar11) ||
                   ((uVar17 = uVar25, sVar11 == (short)local_b8 && ((short)local_c0 <= sVar28))))
                goto LAB_0019d563;
              }
              local_d0 = local_d0 + ((int)local_d0 < (int)local_a8);
              pWVar26 = local_a0 + (int)uVar17;
LAB_0019d451:
              pWVar26->maskLoop = pWVar7->maskSelf | pWVar15->maskLoop;
              pWVar26->revLoop = local_c8;
              pWVar26->nRow = sVar16;
              pWVar26->rCost = sVar11;
              pWVar26->rUnsorted = sVar28;
              pWVar26->isOrdered = bVar8;
              memcpy(pWVar26->aLoop,pWVar15->aLoop,local_38);
              pWVar26->aLoop[local_98] = pWVar7;
              uVar31 = local_c0;
              uVar29 = local_b8;
              if (iVar14 <= (int)local_d0) {
                uVar25 = 0;
                uVar31 = (ulong)(ushort)local_a0->nRow;
                uVar29 = (ulong)(ushort)local_a0->rCost;
                if (1 < (byte)local_48) {
                  uVar25 = 0;
                  uVar17 = 1;
                  pLVar20 = local_40;
                  do {
                    uVar12 = pLVar20[-1];
                    if ((short)(ushort)uVar29 < (short)uVar12) {
                      uVar3 = *pLVar20;
LAB_0019d52a:
                      uVar31 = (ulong)uVar3;
                      uVar29 = (ulong)uVar12;
                      uVar25 = uVar17;
                    }
                    else if ((uVar12 == (ushort)uVar29) &&
                            (uVar3 = *pLVar20, (short)uVar31 < (short)uVar3)) goto LAB_0019d52a;
                    uVar17 = uVar17 + 1;
                    pLVar20 = pLVar20 + 0x10;
                  } while (local_5c != uVar17);
                }
              }
            }
LAB_0019d563:
            pWInfo = local_70;
          }
          uVar18 = uVar18 + 1;
          pWVar15 = pWVar15 + 1;
        } while (uVar18 != local_54);
      }
      pPVar23 = local_88;
      local_98 = local_98 + 1;
      pWVar15 = local_d8;
      local_d8 = local_a0;
      uVar17 = local_d0;
    } while (local_98 != local_48);
    if (local_d0 == 0) {
      sqlite3ErrorMsg(local_88,"no query solution");
      pWVar15 = local_50;
      goto LAB_0019d80e;
    }
    if (1 < (int)local_d0) {
      lVar22 = (ulong)local_d0 - 1;
      pWVar26 = local_a0;
      pWVar15 = local_a0;
      do {
        local_d8 = pWVar15 + 1;
        if (pWVar26->rCost <= pWVar15[1].rCost) {
          local_d8 = pWVar26;
        }
        lVar22 = lVar22 + -1;
        pWVar26 = local_d8;
        pWVar15 = pWVar15 + 1;
      } while (lVar22 != 0);
    }
    uVar30 = local_48;
    pWVar15 = local_50;
    if (local_48 != 0) {
      ppWVar5 = local_d8->aLoop;
      pSVar6 = pWInfo->pTabList;
      ppWVar27 = &pWInfo->a[0].pWLoop;
      uVar31 = 0;
      do {
        pWVar7 = ppWVar5[uVar31];
        *ppWVar27 = pWVar7;
        bVar8 = pWVar7->iTab;
        *(byte *)(ppWVar27 + -4) = bVar8;
        *(int *)((long)ppWVar27 + -0x5c) = pSVar6->a[bVar8].iCursor;
        uVar31 = uVar31 + 1;
        ppWVar27 = ppWVar27 + 0xe;
      } while ((local_48 & 0xffffffff) != uVar31);
    }
  }
  pPVar23 = local_88;
  if (((((pWInfo->wctrlFlags & 0x180) == 0x100) && ((short)local_80 != 0)) &&
      (pWInfo->eDistinct == '\0')) &&
     (iVar9 = wherePathSatisfiesOrderBy
                        (pWInfo,pWInfo->pResultSet,local_d8,0x80,(short)uVar30 - 1,
                         local_d8->aLoop[uVar30 - 1],&local_c8),
     pWInfo->pResultSet->nExpr == (int)iVar9)) {
    pWInfo->eDistinct = '\x02';
  }
  bVar8 = pWInfo->field_0x44;
  pWInfo->field_0x44 = bVar8 & 0xfb;
  pOrderBy = pWInfo->pOrderBy;
  if (pOrderBy != (ExprList *)0x0) {
    cVar2 = local_d8->isOrdered;
    pWInfo->nOBSat = cVar2;
    uVar12 = pWInfo->wctrlFlags;
    uVar25 = (uint)uVar12;
    if ((char)uVar12 < '\0') {
      if (pOrderBy->nExpr == (int)cVar2) {
        pWInfo->eDistinct = '\x02';
      }
    }
    else {
      pWInfo->revMask = local_d8->revLoop;
      if (cVar2 < '\x01') {
        pWInfo->nOBSat = '\0';
        if (uVar30 != 0) {
          uVar18 = (int)uVar30 - 1;
          uVar17 = local_d8->aLoop[uVar18]->wsFlags;
          if ((~uVar17 & 0x104) != 0 && (uVar17 >> 0xc & 1) == 0) {
            local_c8 = 0;
            iVar9 = wherePathSatisfiesOrderBy
                              (pWInfo,pOrderBy,local_d8,0x800,(u16)uVar18,local_d8->aLoop[uVar18],
                               &local_c8);
            pOrderBy = pWInfo->pOrderBy;
            if (pOrderBy->nExpr == (int)iVar9) {
              pWInfo->field_0x44 = pWInfo->field_0x44 | 4;
              pWInfo->revMask = local_c8;
            }
            uVar25 = (uint)pWInfo->wctrlFlags;
          }
        }
      }
      else if (((uVar12 & 3) != 0 && uVar30 != 0) && cVar2 == '\x01') {
        pWInfo->field_0x44 = bVar8 | 4;
      }
    }
    if ((((uVar25 >> 9 & 1) != 0) && (uVar30 != 0)) && (pOrderBy->nExpr == (int)pWInfo->nOBSat)) {
      local_c8 = 0;
      uVar25 = (int)uVar30 - 1;
      iVar9 = wherePathSatisfiesOrderBy
                        (pWInfo,pOrderBy,local_d8,0,(u16)uVar25,local_d8->aLoop[uVar25],&local_c8);
      if (pWInfo->pOrderBy->nExpr == (int)iVar9) {
        pWInfo->field_0x44 = pWInfo->field_0x44 | 8;
        pWInfo->revMask = local_c8;
      }
    }
  }
  pWInfo->nRowOut = local_d8->nRow;
LAB_0019d80e:
  sqlite3DbFreeNN(pPVar23->db,pWVar15);
  return extraout_EAX;
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsorted = 0;    /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  nLoop = pWInfo->nLevel;
  /* TUNING: For simple queries, only the best path is tracked.
  ** For 2-way joins, the 5 best paths are followed.
  ** For joins of 3 or more tables, track the 10 best paths */
  mxChoice = (nLoop<=1) ? 1 : (nLoop==2 ? 5 : 10);
  assert( nLoop<=pWInfo->pTabList->nSrc );
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d)\n", nRowEst));

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3StackAllocRawNN(pParse->db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered,
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsorted;                 /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered;                     /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask;                  /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<3 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 1.25 times.  It is tempting to also exclude
          ** automatic index usage on an outer loop, but sometimes an automatic
          ** index is useful in the outer loop of a correlated subquery. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }

        /* At this point, pWLoop is a candidate to be the next loop.
        ** Compute its cost */
        rUnsorted = sqlite3LogEstAdd(pWLoop->rSetup,pWLoop->rRun + pFrom->nRow);
        rUnsorted = sqlite3LogEstAdd(rUnsorted, pFrom->rUnsorted);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        isOrdered = pFrom->isOrdered;
        if( isOrdered<0 ){
          revMask = 0;
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          /* TUNING:  Add a small extra penalty (5) to sorting as an
          ** extra encouragment to the query planner to select a plan
          ** where the rows emerge in the correct order without any sorting
          ** required. */
          rCost = sqlite3LogEstAdd(rUnsorted, aSortCost[isOrdered]) + 5;

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy,
               rUnsorted, rCost));
        }else{
          rCost = rUnsorted;
          rUnsorted -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* TUNING:  A full-scan of a VIEW or subquery in the outer loop
        ** is not so bad. */
        if( iLoop==0 && (pWLoop->wsFlags & WHERE_VIEWSCAN)!=0 ){
          rCost += -10;
          nOut += -30;
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsorted>=mxUnsorted))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          **
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsorted) <= (rCost,nOut,rUnsorted)
          */
          if( pTo->rCost<rCost
           || (pTo->rCost==rCost
               && (pTo->nRow<nOut
                   || (pTo->nRow==nOut && pTo->rUnsorted<=rUnsorted)
                  )
              )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsorted = rUnsorted;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsorted = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost
             || (pTo->rCost==mxCost && pTo->rUnsorted>mxUnsorted)
            ){
              mxCost = pTo->rCost;
              mxUnsorted = pTo->rUnsorted;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
        sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
           wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
           pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
        if( pTo->isOrdered>0 ){
          sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
        }else{
          sqlite3DebugPrintf("\n");
        }
      }
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3StackFreeNN(pParse->db, pSpace);
    return SQLITE_ERROR;
  }

  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  pWInfo->bOrderedInnerLoop = 0;
  if( pWInfo->pOrderBy ){
    pWInfo->nOBSat = pFrom->isOrdered;
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
    }else{
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }else if( nLoop
            && pWInfo->nOBSat==1
            && (pWInfo->wctrlFlags & (WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX))!=0
            ){
        pWInfo->bOrderedInnerLoop = 1;
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy,
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }


  pWInfo->nRowOut = pFrom->nRow;

  /* Free temporary memory and return success */
  sqlite3StackFreeNN(pParse->db, pSpace);
  return SQLITE_OK;
}